

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O2

__m128i highbd_calculate_dqcoeff(__m128i qcoeff,__m128i dequant,int log_scale)

{
  longlong extraout_RAX;
  longlong extraout_RDX;
  uint in_XMM0_Da;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  __m128i alVar1;
  __m128i abs_coeff;
  int local_28;
  int iStack_24;
  int iStack_20;
  int iStack_1c;
  longlong local_18 [2];
  
  local_28 = (in_XMM0_Da ^ (int)in_XMM0_Da >> 0x1f) - ((int)in_XMM0_Da >> 0x1f);
  iStack_24 = (in_XMM0_Db ^ (int)in_XMM0_Db >> 0x1f) - ((int)in_XMM0_Db >> 0x1f);
  iStack_20 = (in_XMM0_Dc ^ (int)in_XMM0_Dc >> 0x1f) - ((int)in_XMM0_Dc >> 0x1f);
  iStack_1c = (in_XMM0_Dd ^ (int)in_XMM0_Dd >> 0x1f) - ((int)in_XMM0_Dd >> 0x1f);
  highbd_mul_shift_sse2((__m128i *)&local_28,&local_18,(__m128i *)&local_28,(int)qcoeff[0]);
  alVar1[1] = extraout_RDX;
  alVar1[0] = extraout_RAX;
  return alVar1;
}

Assistant:

static inline __m128i highbd_calculate_dqcoeff(__m128i qcoeff, __m128i dequant,
                                               const int log_scale) {
  __m128i coeff_sign = _mm_srai_epi32(qcoeff, 31);
  __m128i abs_coeff = invert_sign_32_sse2(qcoeff, coeff_sign);
  highbd_mul_shift_sse2(&abs_coeff, &dequant, &abs_coeff, log_scale);
  return invert_sign_32_sse2(abs_coeff, coeff_sign);
}